

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_build_name_lists(anm_archive_t *anm)

{
  char *pcVar1;
  anm_entry_t *paVar2;
  list_node_t *plVar3;
  list_node_t *plVar4;
  anm_entry_t **ppaVar5;
  anm_entry_t *tmp;
  
  plVar3 = (anm->names).head;
  if (plVar3 != (list_node_t *)0x0) {
    do {
      plVar4 = (anm->entries).head;
      if (plVar4 != (list_node_t *)0x0) {
        pcVar1 = (char *)plVar3->data;
        ppaVar5 = &tmp;
        do {
          paVar2 = (anm_entry_t *)plVar4->data;
          if (paVar2->name == pcVar1) {
            *ppaVar5 = paVar2;
            ppaVar5 = &paVar2->next_by_name;
          }
          plVar4 = plVar4->next;
        } while (plVar4 != (list_node_t *)0x0);
      }
      plVar3 = plVar3->next;
    } while (plVar3 != (list_node_t *)0x0);
  }
  return;
}

Assistant:

static void
anm_build_name_lists(
    const anm_archive_t *anm)
{
    const char *name;
    anm_entry_t *entry, *tmp, **nextloc;
    list_for_each(&anm->names, name) {
        nextloc = &tmp;
        list_for_each(&anm->entries, entry)
            if (entry->name == name) {
                *nextloc = entry;
                nextloc = &entry->next_by_name;
            }
    }
}